

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall kj::WebSocket::pumpTo(WebSocket *this,WebSocket *other)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> node;
  WebSocket WVar3;
  void *pvVar4;
  WebSocket *in_RDX;
  TransformPromiseNodeBase *this_00;
  Exception *e;
  OwnPromiseNode local_578;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_570;
  WebSocket local_568 [15];
  char local_4f0 [8];
  _func_int **local_4e8;
  undefined1 local_358 [16];
  undefined8 local_348;
  
  (*in_RDX->_vptr_WebSocket[8])(local_4f0);
  if (local_4f0[0] == '\0') {
    this->_vptr_WebSocket = (_func_int **)0x0;
    (*in_RDX->_vptr_WebSocket[5])(&local_578);
    OVar2.ptr = local_578.ptr;
    pPVar1 = ((local_578.ptr)->super_PromiseArenaMember).arena;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_578.ptr - (long)pPVar1) < 0x28) {
      pvVar4 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_578,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3802:53)>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_0061a638;
      *(WebSocket **)((long)pvVar4 + 0x3f8) = other;
      *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
    }
    else {
      ((local_578.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)&local_578.ptr[-3].super_PromiseArenaMember.arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_578,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3802:53)>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0061a638;
      OVar2.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)other;
      OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
    }
    local_358._0_8_ = &DAT_0048a171;
    local_358._8_8_ = &DAT_0048a1d0;
    local_348 = &DAT_4c0000058b;
    local_568[0]._vptr_WebSocket = (_func_int **)this_00;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_570,(OwnPromiseNode *)local_568,(SourceLocation *)local_358
              );
    WVar3._vptr_WebSocket = local_568[0]._vptr_WebSocket;
    if ((TransformPromiseNodeBase *)local_568[0]._vptr_WebSocket != (TransformPromiseNodeBase *)0x0)
    {
      local_568[0]._vptr_WebSocket = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)WVar3._vptr_WebSocket);
    }
    OVar2.ptr = local_578.ptr;
    if (&(local_578.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_578.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
    pumpWebSocketLoop((kj *)&local_578,other,in_RDX);
    local_358._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    local_358._8_8_ = "operator()";
    local_348._0_4_ = 0xedf;
    local_348._4_4_ = 0xe;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
              ((PromiseDisposer *)local_568,&local_578,&local_570,(SourceLocation *)local_358);
    WVar3._vptr_WebSocket = local_568[0]._vptr_WebSocket;
    OVar2.ptr = local_578.ptr;
    if (&(local_578.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_578.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
    node.ptr = local_570.ptr;
    if (&(local_570.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_570.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
    }
    this->_vptr_WebSocket = (_func_int **)WVar3;
  }
  else {
    this->_vptr_WebSocket = local_4e8;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> WebSocket::pumpTo(WebSocket& other) {
  KJ_IF_SOME(p, other.tryPumpFrom(*this)) {
    // Yay, optimized pump!
    return kj::mv(p);
  } else {
    // Fall back to default implementation.
    return kj::evalNow([&]() {
      auto cancelPromise = other.whenAborted().then([this]() -> kj::Promise<void> {
        this->abort();
        return KJ_EXCEPTION(DISCONNECTED,
            "destination of WebSocket pump disconnected prematurely");
      });
      return pumpWebSocketLoop(*this, other).exclusiveJoin(kj::mv(cancelPromise));
    });
  }
}